

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

string * __thiscall
hgdb::json::JSONWriter::escape_abi_cxx11_
          (string *__return_storage_ptr__,JSONWriter *this,string_view value)

{
  const_iterator pvVar1;
  ostream *poVar2;
  value_type_conflict1 c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  stringstream ss;
  ostream local_198 [376];
  undefined1 local_20 [8];
  string_view value_local;
  
  value_local._M_len = value._M_len;
  local_20 = (undefined1  [8])this;
  value_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  for (; __end2 != pvVar1; __end2 = __end2 + 1) {
    if (*__end2 == '\\') {
      poVar2 = std::operator<<(local_198,'\\');
      std::operator<<(poVar2,'\\');
    }
    else {
      std::operator<<(local_198,*__end2);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape(std::string_view value) {
        std::stringstream ss;
        for (auto c : value) {
            if (c == '\\') {
                ss << '\\' << '\\';
            } else {
                ss << c;
            }
        }

        return ss.str();
    }